

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_dictionary.cc
# Opt level: O0

Iterator * __thiscall
ctemplate::TemplateDictionary::CreateSectionIterator
          (TemplateDictionary *this,TemplateString *section_name)

{
  small_map<std::map<unsigned_long,_std::vector<ctemplate::TemplateDictionary_*,_ctemplate::ArenaAllocator<ctemplate::TemplateDictionary_*,_ctemplate::UnsafeArena>_>_*,_std::less<unsigned_long>,_ctemplate::ArenaAllocator<std::pair<const_unsigned_long,_std::vector<ctemplate::TemplateDictionary_*,_ctemplate::ArenaAllocator<ctemplate::TemplateDictionary_*,_ctemplate::UnsafeArena>_>_*>,_ctemplate::UnsafeArena>_>,_4,_std::equal_to<unsigned_long>,_ctemplate::TemplateDictionary::map_arena_init>
  *psVar1;
  TemplateDictionary *pTVar2;
  TemplateId TVar3;
  second_type pvVar4;
  Iterator<__gnu_cxx::__normal_iterator<ctemplate::TemplateDictionary_*const_*,_std::vector<ctemplate::TemplateDictionary_*,_ctemplate::ArenaAllocator<ctemplate::TemplateDictionary_*,_ctemplate::UnsafeArena>_>_>_>
  *pIVar5;
  DictVector *it_1;
  TemplateDictionary *template_global_dict;
  DictVector *it;
  TemplateDictionary *d;
  TemplateString *section_name_local;
  TemplateDictionary *this_local;
  
  it = (DictVector *)this;
  do {
    if (it == (DictVector *)0x0) {
      if (this->template_global_dict_owner_ == (TemplateDictionary *)0x0) {
        __assert_fail("template_global_dict_owner_",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/template_dictionary.cc"
                      ,0x3fc,
                      "virtual TemplateDictionaryInterface::Iterator *ctemplate::TemplateDictionary::CreateSectionIterator(const TemplateString &) const"
                     );
      }
      pTVar2 = this->template_global_dict_owner_->template_global_dict_;
      if ((pTVar2 != (TemplateDictionary *)0x0) && (pTVar2->section_dict_ != (SectionDict *)0x0)) {
        psVar1 = pTVar2->section_dict_;
        TVar3 = TemplateString::GetGlobalId(section_name);
        pvVar4 = find_ptr2<ctemplate::small_map<std::map<unsigned_long,std::vector<ctemplate::TemplateDictionary*,ctemplate::ArenaAllocator<ctemplate::TemplateDictionary*,ctemplate::UnsafeArena>>*,std::less<unsigned_long>,ctemplate::ArenaAllocator<std::pair<unsigned_long_const,std::vector<ctemplate::TemplateDictionary*,ctemplate::ArenaAllocator<ctemplate::TemplateDictionary*,ctemplate::UnsafeArena>>*>,ctemplate::UnsafeArena>>,4,std::equal_to<unsigned_long>,ctemplate::TemplateDictionary::map_arena_init>,unsigned_long>
                           (psVar1,TVar3);
        if (pvVar4 != (second_type)0x0) {
          pIVar5 = MakeIterator<std::vector<ctemplate::TemplateDictionary*,ctemplate::ArenaAllocator<ctemplate::TemplateDictionary*,ctemplate::UnsafeArena>>>
                             (pvVar4);
          return &pIVar5->super_Iterator;
        }
      }
      __assert_fail("\"Call IsHiddenSection before GetDictionaries\" && 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/template_dictionary.cc"
                    ,0x404,
                    "virtual TemplateDictionaryInterface::Iterator *ctemplate::TemplateDictionary::CreateSectionIterator(const TemplateString &) const"
                   );
    }
    if (it[2].
        super__Vector_base<ctemplate::TemplateDictionary_*,_ctemplate::ArenaAllocator<ctemplate::TemplateDictionary_*,_ctemplate::UnsafeArena>_>
        ._M_impl.super__Tp_alloc_type.arena_ != (UnsafeArena *)0x0) {
      psVar1 = (small_map<std::map<unsigned_long,_std::vector<ctemplate::TemplateDictionary_*,_ctemplate::ArenaAllocator<ctemplate::TemplateDictionary_*,_ctemplate::UnsafeArena>_>_*,_std::less<unsigned_long>,_ctemplate::ArenaAllocator<std::pair<const_unsigned_long,_std::vector<ctemplate::TemplateDictionary_*,_ctemplate::ArenaAllocator<ctemplate::TemplateDictionary_*,_ctemplate::UnsafeArena>_>_*>,_ctemplate::UnsafeArena>_>,_4,_std::equal_to<unsigned_long>,_ctemplate::TemplateDictionary::map_arena_init>
                *)it[2].
                  super__Vector_base<ctemplate::TemplateDictionary_*,_ctemplate::ArenaAllocator<ctemplate::TemplateDictionary_*,_ctemplate::UnsafeArena>_>
                  ._M_impl.super__Tp_alloc_type.arena_;
      TVar3 = TemplateString::GetGlobalId(section_name);
      pvVar4 = find_ptr2<ctemplate::small_map<std::map<unsigned_long,std::vector<ctemplate::TemplateDictionary*,ctemplate::ArenaAllocator<ctemplate::TemplateDictionary*,ctemplate::UnsafeArena>>*,std::less<unsigned_long>,ctemplate::ArenaAllocator<std::pair<unsigned_long_const,std::vector<ctemplate::TemplateDictionary*,ctemplate::ArenaAllocator<ctemplate::TemplateDictionary*,ctemplate::UnsafeArena>>*>,ctemplate::UnsafeArena>>,4,std::equal_to<unsigned_long>,ctemplate::TemplateDictionary::map_arena_init>,unsigned_long>
                         (psVar1,TVar3);
      if (pvVar4 != (second_type)0x0) {
        pIVar5 = MakeIterator<std::vector<ctemplate::TemplateDictionary*,ctemplate::ArenaAllocator<ctemplate::TemplateDictionary*,ctemplate::UnsafeArena>>>
                           (pvVar4);
        return &pIVar5->super_Iterator;
      }
    }
    it = (DictVector *)
         it[3].
         super__Vector_base<ctemplate::TemplateDictionary_*,_ctemplate::ArenaAllocator<ctemplate::TemplateDictionary_*,_ctemplate::UnsafeArena>_>
         ._M_impl.super__Tp_alloc_type.arena_;
  } while( true );
}

Assistant:

TemplateDictionaryInterface::Iterator*
TemplateDictionary::CreateSectionIterator(
    const TemplateString& section_name) const {
  for (const TemplateDictionary* d = this; d; d = d->parent_dict_) {
    if (d->section_dict_) {
      if (const DictVector* it = find_ptr2(*d->section_dict_, section_name.GetGlobalId())) {
        // Found it!  Return it as an Iterator
        return MakeIterator(*it);
      }
    }
  }
  // Check the template global dictionary.
  assert(template_global_dict_owner_);
  const TemplateDictionary* template_global_dict =
      template_global_dict_owner_->template_global_dict_;
  if (template_global_dict && template_global_dict->section_dict_) {
    if (const DictVector* it = find_ptr2(*template_global_dict->section_dict_, section_name.GetGlobalId())) {
      return MakeIterator(*it);
    }
  }
  assert("Call IsHiddenSection before GetDictionaries" && 0);
  abort();
}